

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O1

bool __thiscall
iDynTree::InverseKinematics::getPoseForFrame
          (InverseKinematics *this,string *frameName,MatrixView<double> *transform)

{
  char *pcVar1;
  char *pcVar2;
  
  if ((transform->m_rows == 4) && (transform->m_cols == 4)) {
    pcVar2 = "";
    pcVar1 = "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics";
  }
  else {
    pcVar2 = "getPoseForFrame";
    pcVar1 = "Invalid size of the transform matrix";
  }
  iDynTree::reportError("InverseKinematics",pcVar2,pcVar1);
  return false;
}

Assistant:

bool InverseKinematics::getPoseForFrame(const std::string& frameName,
                                            iDynTree::MatrixView<double> transform)
    {
        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        const bool ok = (transform.rows() == expected_transform_rows)
            && (transform.cols() == expected_transform_cols);
        if (!ok)
        {
            reportError("InverseKinematics",
                        "getPoseForFrame",
                        "Invalid size of the transform matrix");
            return false;
        }

#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        toEigen(transform) = toEigen(IK_PIMPL(m_pimpl)->dynamics().getWorldTransform(frameName).asHomogeneousTransform());
        return true;
#else
        return missingIpoptErrorReport();
#endif
    }